

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O0

int __thiscall TokenStreamTokenizer::init(TokenStreamTokenizer *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  Token local_98;
  reference local_38;
  Token *tok;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Token,_std::allocator<Token>_> *__range1;
  vector<Token,_std::allocator<Token>_> *tokens_local;
  TokenStreamTokenizer *this_local;
  
  Tokenizer::clearTokens(&this->super_Tokenizer);
  __end1 = std::vector<Token,_std::allocator<Token>_>::begin
                     ((vector<Token,_std::allocator<Token>_> *)ctx);
  tok = (Token *)std::vector<Token,_std::allocator<Token>_>::end
                           ((vector<Token,_std::allocator<Token>_> *)ctx);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>
                                *)&tok);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
               operator*(&__end1);
    Token::Token(&local_98,local_38);
    Tokenizer::addToken(&this->super_Tokenizer,&local_98);
    Token::~Token(&local_98);
    __gnu_cxx::__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>::
    operator++(&__end1);
  }
  Tokenizer::resetPosition(&this->super_Tokenizer);
  return extraout_EAX;
}

Assistant:

void init(const std::vector<Token>& tokens)
	{
		clearTokens();

		for (const Token &tok: tokens)
			addToken(tok);
		
		resetPosition();
	}